

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall duckdb::SingleFileBlockManager::LoadFreeList(SingleFileBlockManager *this)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this_00;
  unordered_map<long,_unsigned_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>
  *this_01;
  ulong uVar1;
  mapped_type mVar2;
  SingleFileBlockManager *this_02;
  MetadataManager *pMVar3;
  mapped_type *pmVar4;
  long lVar5;
  MetaBlockPointer pointer;
  unsigned_long value;
  long block;
  MetadataReader reader;
  mapped_type local_b8;
  undefined4 uStack_b4;
  SingleFileBlockManager *local_b0;
  long local_a8;
  MetadataReader local_a0;
  
  uVar1 = this->free_list_id;
  if (uVar1 != 0xffffffffffffffff) {
    pMVar3 = BlockManager::GetMetadataManager(&this->super_BlockManager);
    pointer.offset = 0;
    pointer.unused_padding = 0;
    pointer.block_pointer = uVar1;
    MetadataReader::MetadataReader
              (&local_a0,pMVar3,pointer,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
               REGISTER_BLOCKS);
    (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_b8,8);
    lVar5 = CONCAT44(uStack_b4,local_b8);
    local_b0 = this;
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::clear
              (&(this->free_list)._M_t);
    if (lVar5 != 0) {
      this_00 = &local_b0->newly_freed_list;
      do {
        (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_b8,8);
        ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &this->free_list,&local_a8);
        ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   this_00,&local_a8);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_b8,8);
    lVar5 = CONCAT44(uStack_b4,local_b8);
    this_01 = &local_b0->multi_use_blocks;
    ::std::
    _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&this_01->_M_h);
    if (lVar5 != 0) {
      do {
        (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_b8,8);
        (**local_a0.super_ReadStream._vptr_ReadStream)(&local_a0,&local_b8,4);
        mVar2 = local_b8;
        pmVar4 = ::std::__detail::
                 _Map_base<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_01,&local_a8);
        *pmVar4 = mVar2;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    this_02 = local_b0;
    pMVar3 = BlockManager::GetMetadataManager(&local_b0->super_BlockManager);
    MetadataManager::Read(pMVar3,&local_a0.super_ReadStream);
    pMVar3 = BlockManager::GetMetadataManager(&this_02->super_BlockManager);
    MetadataManager::MarkBlocksAsModified(pMVar3);
    MetadataReader::~MetadataReader(&local_a0);
  }
  return;
}

Assistant:

void SingleFileBlockManager::LoadFreeList() {
	MetaBlockPointer free_pointer(free_list_id, 0);
	if (!free_pointer.IsValid()) {
		// no free list
		return;
	}
	MetadataReader reader(GetMetadataManager(), free_pointer, nullptr, BlockReaderType::REGISTER_BLOCKS);
	auto free_list_count = reader.Read<uint64_t>();
	free_list.clear();
	for (idx_t i = 0; i < free_list_count; i++) {
		auto block = reader.Read<block_id_t>();
		free_list.insert(block);
		newly_freed_list.insert(block);
	}
	auto multi_use_blocks_count = reader.Read<uint64_t>();
	multi_use_blocks.clear();
	for (idx_t i = 0; i < multi_use_blocks_count; i++) {
		auto block_id = reader.Read<block_id_t>();
		auto usage_count = reader.Read<uint32_t>();
		multi_use_blocks[block_id] = usage_count;
	}
	GetMetadataManager().Read(reader);
	GetMetadataManager().MarkBlocksAsModified();
}